

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression *
slang::ast::UnboundedLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  Compilation *this;
  LiteralExpressionSyntax *this_00;
  bool bVar1;
  Token *this_01;
  Type *args;
  SourceRange local_58;
  SourceRange local_48;
  DiagCode local_34;
  bitmask<slang::ast::ASTFlags> local_30;
  Compilation *local_28;
  Compilation *comp;
  LiteralExpressionSyntax *syntax_local;
  ASTContext *context_local;
  
  comp = (Compilation *)syntax;
  syntax_local = (LiteralExpressionSyntax *)context;
  if ((syntax->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind !=
      WildcardLiteralExpression) {
    assert::assertFailed
              ("syntax.kind == SyntaxKind::WildcardLiteralExpression",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
               ,0xc0,
               "static Expression &slang::ast::UnboundedLiteral::fromSyntax(const ASTContext &, const LiteralExpressionSyntax &)"
              );
  }
  local_28 = ASTContext::getCompilation(context);
  this_01 = &syntax_local->literal;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,AllowUnboundedLiteral);
  bVar1 = bitmask<slang::ast::ASTFlags>::has((bitmask<slang::ast::ASTFlags> *)this_01,&local_30);
  this_00 = syntax_local;
  this = local_28;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    args = Compilation::getUnboundedType(local_28);
    local_58 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)comp);
    context_local =
         (ASTContext *)
         BumpAllocator::
         emplace<slang::ast::UnboundedLiteral,slang::ast::Type_const&,slang::SourceRange>
                   (&this->super_BumpAllocator,args,&local_58);
  }
  else {
    local_34.subsystem = Expressions;
    local_34.code = 0x8e;
    local_48 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)comp);
    ASTContext::addDiag((ASTContext *)this_00,local_34,local_48);
    context_local = (ASTContext *)Expression::badExpr(local_28,(Expression *)0x0);
  }
  return (Expression *)context_local;
}

Assistant:

Expression& UnboundedLiteral::fromSyntax(const ASTContext& context,
                                         const LiteralExpressionSyntax& syntax) {
    ASSERT(syntax.kind == SyntaxKind::WildcardLiteralExpression);

    auto& comp = context.getCompilation();
    if (!context.flags.has(ASTFlags::AllowUnboundedLiteral)) {
        context.addDiag(diag::UnboundedNotAllowed, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    return *comp.emplace<UnboundedLiteral>(comp.getUnboundedType(), syntax.sourceRange());
}